

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-impl.h
# Opt level: O2

size_t ggml_hash_find(ggml_hash_set *hash_set,ggml_tensor *key)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = ((ulong)key >> 4) % hash_set->size;
  uVar1 = uVar2;
  while( true ) {
    if ((hash_set->used[uVar1 >> 5] >> ((uint)uVar1 & 0x1f) & 1) == 0) {
      return uVar1;
    }
    if (hash_set->keys[uVar1] == key) break;
    uVar1 = uVar1 + 1;
    if (uVar1 == hash_set->size) {
      uVar1 = 0;
    }
    if (uVar1 == uVar2) {
      return 0xffffffffffffffff;
    }
  }
  return uVar1;
}

Assistant:

static size_t ggml_hash_find(const struct ggml_hash_set * hash_set, const struct ggml_tensor * key) {
    size_t h = ggml_hash(key) % hash_set->size;

    // linear probing
    size_t i = h;
    while (ggml_bitset_get(hash_set->used, i) && hash_set->keys[i] != key) {
        i = (i + 1) % hash_set->size;
        if (i == h) {
            // visited all hash table entries -> not found
            return GGML_HASHSET_FULL;
        }
    }
    return i;
}